

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int MRIStepReInit(void *arkode_mem,ARKRhsFn fse,ARKRhsFn fsi,sunrealtype t0,N_Vector y0)

{
  int iVar1;
  SUNNonlinearSolver arkode_mem_00;
  sunrealtype in_RCX;
  long in_RDX;
  long in_RSI;
  ARKodeMem in_XMM0_Qa;
  int retval;
  SUNNonlinearSolver NLS;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SUNContext_conflict in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  ARKodeMem in_stack_ffffffffffffffc8;
  uint local_4;
  
  local_4 = mriStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffb8,
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,(ARKodeMRIStepMem *)0x1888b9);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffc8->MallocDone == 0) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x17,0x132,"MRIStepReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Attempt to call before ARKodeInit.");
      local_4 = 0xffffffe9;
    }
    else if ((in_RSI == 0) && (in_RDX == 0)) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x16,0x13a,"MRIStepReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Must specify at least one of fe, fi (both NULL).");
      local_4 = 0xffffffea;
    }
    else if (in_RCX == 0.0) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x16,0x142,"MRIStepReInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"y0 = NULL illegal.");
      local_4 = 0xffffffea;
    }
    else {
      *(uint *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x18) =
           (uint)(in_RSI != 0);
      *(uint *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x1c) =
           (uint)(in_RDX != 0);
      if ((*(int *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x1c) != 0) &&
         (*(long *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0xa8) == 0)) {
        arkode_mem_00 =
             SUNNonlinSol_Newton((N_Vector)
                                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffb8);
        if (arkode_mem_00 == (SUNNonlinearSolver)0x0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x14,0x152,"MRIStepReInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                          ,"Error creating default Newton solver");
          ARKodeFree((void **)CONCAT44(local_4,in_stack_ffffffffffffffb0));
          return -0x14;
        }
        iVar1 = ARKodeSetNonlinearSolver
                          (arkode_mem_00,
                           (SUNNonlinearSolver)CONCAT44(local_4,in_stack_ffffffffffffffb0));
        if (iVar1 != 0) {
          arkProcessError(in_stack_ffffffffffffffc8,-0x14,0x15a,"MRIStepReInit",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                          ,"Error attaching default Newton solver");
          ARKodeFree((void **)CONCAT44(iVar1,in_stack_ffffffffffffffb0));
          return -0x14;
        }
        *(undefined4 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0xb0) = 1;
      }
      local_4 = arkInit(in_XMM0_Qa,in_RCX,(N_Vector)in_stack_ffffffffffffffc8,
                        in_stack_ffffffffffffffc4);
      if (local_4 == 0) {
        *(long *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) = in_RSI;
        *(long *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 8) = in_RDX;
        *(undefined4 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x3c) = 0;
        *(undefined4 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x40) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x198) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x1a0) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x1a8) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x120) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x1b0) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x1b8) = 0;
        *(undefined8 *)(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0) + 0x1c0) = 0;
        local_4 = 0;
      }
      else {
        arkProcessError(in_stack_ffffffffffffffc8,(int)(ulong)local_4,0x166,"MRIStepReInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                        ,"Unable to reinitialize main ARKODE infrastructure");
      }
    }
  }
  return local_4;
}

Assistant:

int MRIStepReInit(void* arkode_mem, ARKRhsFn fse, ARKRhsFn fsi, sunrealtype t0,
                  N_Vector y0)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  int retval;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Check if ark_mem was allocated */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Check that at least one of fse, fsi is supplied and is to be used */
  if (fse == NULL && fsi == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (ARK_ILL_INPUT);
  }

  /* Check that y0 is supplied */
  if (y0 == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (ARK_ILL_INPUT);
  }

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit_rhs = (fse == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit_rhs = (fsi == NULL) ? SUNFALSE : SUNTRUE;

  /* Create a default Newton NLS object (just in case; will be deleted if
     the user attaches a nonlinear solver) */
  if (step_mem->implicit_rhs && !(step_mem->NLS))
  {
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (!NLS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error creating default Newton solver");
      ARKodeFree((void**)&ark_mem);
      return (ARK_MEM_FAIL);
    }
    retval = ARKodeSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error attaching default Newton solver");
      ARKodeFree((void**)&ark_mem);
      return (ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* ReInitialize main ARKODE infrastructure */
  retval = arkInit(arkode_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to reinitialize main ARKODE infrastructure");
    return (retval);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->fse            = fse;
  step_mem->fsi            = fsi;
  step_mem->fse_is_current = SUNFALSE;
  step_mem->fsi_is_current = SUNFALSE;

  /* Initialize all the counters */
  step_mem->nfse        = 0;
  step_mem->nfsi        = 0;
  step_mem->nsetups     = 0;
  step_mem->nstlp       = 0;
  step_mem->nls_iters   = 0;
  step_mem->nls_fails   = 0;
  step_mem->inner_fails = 0;

  return (ARK_SUCCESS);
}